

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCMAC.cpp
# Opt level: O3

EVP_CIPHER * __thiscall OSSLCMACAES::getEVPCipher(OSSLCMACAES *this)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_CIPHER *pEVar3;
  undefined4 extraout_var_00;
  long lVar2;
  
  iVar1 = (*(((this->super_OSSLEVPCMacAlgorithm).super_MacAlgorithm.currentKey)->super_Serialisable)
            ._vptr_Serialisable[7])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 0x100) {
    pEVar3 = EVP_aes_256_cbc();
    return (EVP_CIPHER *)pEVar3;
  }
  if (lVar2 != 0xc0) {
    if (lVar2 == 0x80) {
      pEVar3 = EVP_aes_128_cbc();
      return (EVP_CIPHER *)pEVar3;
    }
    iVar1 = (*(((this->super_OSSLEVPCMacAlgorithm).super_MacAlgorithm.currentKey)->
              super_Serialisable)._vptr_Serialisable[7])();
    softHSMLog(3,"getEVPCipher",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCMAC.cpp"
               ,0x4b,"Invalid AES bit len %i",CONCAT44(extraout_var_00,iVar1));
    return (EVP_CIPHER *)0x0;
  }
  pEVar3 = EVP_aes_192_cbc();
  return (EVP_CIPHER *)pEVar3;
}

Assistant:

const EVP_CIPHER* OSSLCMACAES::getEVPCipher() const
{
	switch(currentKey->getBitLen())
	{
		case 128:
			return EVP_aes_128_cbc();
		case 192:
			return EVP_aes_192_cbc();
		case 256:
			return EVP_aes_256_cbc();
		default:
			break;
	};

	ERROR_MSG("Invalid AES bit len %i", currentKey->getBitLen());

	return NULL;
}